

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_bind(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle_00;
  char *ip;
  lua_Integer lVar2;
  undefined1 local_b0 [4];
  int ret;
  sockaddr_storage addr;
  uint flags;
  int port;
  char *host;
  uv_udp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_udp(L,1);
  ip = luaL_checklstring(L,2,(size_t *)0x0);
  lVar2 = luaL_checkinteger(L,3);
  addr.__ss_align._4_4_ = (uint)lVar2;
  addr.__ss_align._0_4_ = 0;
  iVar1 = uv_ip4_addr(ip,addr.__ss_align._4_4_,(sockaddr_in *)local_b0);
  if ((iVar1 != 0) &&
     (iVar1 = uv_ip6_addr(ip,addr.__ss_align._4_4_,(sockaddr_in6 *)local_b0), iVar1 != 0)) {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,(ulong)addr.__ss_align._4_4_);
    return iVar1;
  }
  iVar1 = lua_type(L,4);
  if (iVar1 == 5) {
    luaL_checktype(L,4,5);
    lua_getfield(L,4,"reuseaddr");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      addr.__ss_align._0_4_ = (uint)addr.__ss_align | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,4,"ipv6only");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      addr.__ss_align._0_4_ = (uint)addr.__ss_align | 1;
    }
    lua_settop(L,-2);
  }
  iVar1 = uv_udp_bind(handle_00,(sockaddr *)local_b0,(uint)addr.__ss_align);
  if (iVar1 < 0) {
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_bind(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  const char* host = luaL_checkstring(L, 2);
  int port = luaL_checkinteger(L, 3);
  unsigned int flags = 0;
  struct sockaddr_storage addr;
  int ret;
  if (uv_ip4_addr(host, port, (struct sockaddr_in*)&addr) &&
      uv_ip6_addr(host, port, (struct sockaddr_in6*)&addr)) {
    return luaL_error(L, "Invalid IP address or port [%s:%d]", host, port);
  }
  if (lua_type(L, 4) == LUA_TTABLE) {
    luaL_checktype(L, 4, LUA_TTABLE);
    lua_getfield(L, 4, "reuseaddr");
    if (lua_toboolean(L, -1)) flags |= UV_UDP_REUSEADDR;
    lua_pop(L, 1);
    lua_getfield(L, 4, "ipv6only");
    if (lua_toboolean(L, -1)) flags |= UV_UDP_IPV6ONLY;
    lua_pop(L, 1);
  }
  ret = uv_udp_bind(handle, (struct sockaddr*)&addr, flags);
  return luv_result(L, ret);
}